

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCheck.h
# Opt level: O0

void __thiscall
cppqc::
CompactCheck<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/examples/src/TestSortCompact.cpp:61:17),_void,_void,_std::vector<int,_std::allocator<int>_>_>
::CompactCheck(CompactCheck<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_philipp_classen[P]CppQuickCheck_examples_src_TestSortCompact_cpp:61:17),_void,_void,_std::vector<int,_std::allocator<int>_>_>
               *this,string *name,CheckFunctionT *checkFunction,TrivialFunctionT *trivialFunctions,
              ClassifyFunctionT *classifyFunction)

{
  undefined1 *in_RDX;
  string *in_RSI;
  Generator<std::vector<int,_std::allocator<int>_>_> *in_RDI;
  Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  *this_00;
  Arbitrary<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffb8;
  Generator<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffc0;
  Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  local_30;
  undefined1 *local_18;
  
  this_00 = &local_30;
  local_18 = in_RDX;
  Generator<std::vector<int,std::allocator<int>>>::
  Generator<cppqc::Arbitrary<std::vector<int,std::allocator<int>>>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  ::Property(this_00,in_RDI);
  Generator<std::vector<int,_std::allocator<int>_>_>::~Generator
            ((Generator<std::vector<int,_std::allocator<int>_>_> *)0x12007b);
  (in_RDI->m_gen)._M_t.
  super___uniq_ptr_impl<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
  .
  super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
  ._M_head_impl = (GenConcept<std::vector<int,_std::allocator<int>_>_> *)&PTR_expect_00139850;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RSI);
  *(undefined1 *)
   &in_RDI[6].m_gen._M_t.
    super___uniq_ptr_impl<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
    .
    super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
    ._M_head_impl = *local_18;
  return;
}

Assistant:

CompactCheck(std::string name,
               CheckFunctionT&& checkFunction,
               TrivialFunctionT&& trivialFunctions,
               ClassifyFunctionT&& classifyFunction)
      : m_name(std::move(name)),
        m_checkFnc(std::move(checkFunction)),
        m_trivialFnc(std::move(trivialFunctions)),
        m_classifyFnc(std::move(classifyFunction)) {}